

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operats.c
# Opt level: O0

Vector * Mul_SV(double S,Vector *V)

{
  LASErrIdType LVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  char *VResName;
  Vector *VRes;
  Vector *V_local;
  double S_local;
  
  V_Lock(V);
  LVar1 = LASResult();
  if (LVar1 == LASOK) {
    VResName = (char *)malloc(0x30);
    pcVar2 = V_GetName(V);
    sVar3 = strlen(pcVar2);
    pcVar2 = (char *)malloc(sVar3 + 0x14);
    if (((Vector *)VResName == (Vector *)0x0) || (pcVar2 == (char *)0x0)) {
      pcVar4 = V_GetName(V);
      LASError(LASMemAllocErr,"Mul_SV",pcVar4,(char *)0x0,(char *)0x0);
      if ((Vector *)VResName != (Vector *)0x0) {
        free(VResName);
      }
    }
    else {
      pcVar4 = V_GetName(V);
      sprintf(pcVar2,"%12.5e * (%s)",S,pcVar4);
      V_Constr((Vector *)VResName,pcVar2,V->Dim,Tempor,False);
      LVar1 = LASResult();
      if (LVar1 == LASOK) {
        ((Vector *)VResName)->Multipl = S * V->Multipl;
        if ((V->Instance == Tempor) && (V->OwnData != False)) {
          V->OwnData = False;
          ((Vector *)VResName)->OwnData = True;
        }
        ((Vector *)VResName)->Cmp = V->Cmp;
      }
    }
    if (pcVar2 != (char *)0x0) {
      free(pcVar2);
    }
  }
  else {
    VResName = (char *)0x0;
  }
  V_Unlock(V);
  return (Vector *)VResName;
}

Assistant:

Vector *Mul_SV(double S, Vector *V)
/* VRes = S * V */
{
    Vector *VRes;

    char *VResName;

    V_Lock(V);
    
    if (LASResult() == LASOK) {
        VRes = (Vector *)malloc(sizeof(Vector));
        VResName = (char *)malloc((strlen(V_GetName(V)) + 20) * sizeof(char));
        if (VRes != NULL && VResName != NULL) {
            sprintf(VResName, "%12.5e * (%s)", S, V_GetName(V));
            V_Constr(VRes, VResName, V->Dim, Tempor, False);
            if (LASResult() == LASOK) {
                VRes->Multipl = S * V->Multipl;
                if (V->Instance == Tempor && V->OwnData) {
                    V->OwnData = False;
                    VRes->OwnData = True;
                }
                VRes->Cmp = V->Cmp;
            }
        } else {
            LASError(LASMemAllocErr, "Mul_SV", V_GetName(V), NULL, NULL);
            if (VRes != NULL)
                free(VRes);
        }
            
        if (VResName != NULL)
            free(VResName);
    } else {
        VRes = NULL;
    }

    V_Unlock(V);

    return(VRes);
}